

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

void get_2d_footprint_cells
               (vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *polygon,
               set<sbpl_2Dcell_t,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_> *cells,
               sbpl_xy_theta_pt_t pose,double res)

{
  pair<int,_int> pVar1;
  double dVar2;
  uint sx;
  int iVar3;
  pointer psVar4;
  int **grid;
  int *__s;
  int iVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  double in_XMM0_Qb;
  undefined1 auVar21 [16];
  double extraout_XMM0_Qb;
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> disc_polygon;
  sbpl_bfs_2d bfs;
  pair<int,_int> local_170;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_148;
  uint local_128;
  int local_124;
  ulong local_120;
  _Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
  *local_118;
  double dStack_110;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  sbpl_bfs_2d local_e8;
  double local_b8;
  double dStack_b0;
  ulong local_a0;
  ulong local_98;
  sbpl_2Dcell_t local_90;
  double local_88;
  double local_78;
  double dStack_70;
  ulong local_60;
  long local_58;
  ulong local_50;
  long local_48;
  int **local_40;
  ulong local_38;
  
  if ((ulong)((long)(polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>)._M_impl
                    .super__Vector_impl_data._M_finish -
             (long)(polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>)._M_impl.
                   super__Vector_impl_data._M_start) < 0x11) {
    auVar21._8_8_ = res;
    auVar21._0_8_ = res;
    auVar24 = divpd(pose._0_16_,auVar21);
    local_e8.dist_ =
         (int **)CONCAT44((int)auVar24._8_8_ - (uint)(pose.y < 0.0),
                          (int)auVar24._0_8_ - (uint)(pose.x < 0.0));
    std::
    _Rb_tree<sbpl_2Dcell_t,sbpl_2Dcell_t,std::_Identity<sbpl_2Dcell_t>,std::less<sbpl_2Dcell_t>,std::allocator<sbpl_2Dcell_t>>
    ::_M_insert_unique<sbpl_2Dcell_t_const&>
              ((_Rb_tree<sbpl_2Dcell_t,sbpl_2Dcell_t,std::_Identity<sbpl_2Dcell_t>,std::less<sbpl_2Dcell_t>,std::allocator<sbpl_2Dcell_t>>
                *)cells,(sbpl_2Dcell_t *)&local_e8);
  }
  else {
    local_118 = (_Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
                 *)res;
    dStack_110 = in_XMM0_Qb;
    local_b8 = cos(pose.theta);
    dStack_b0 = extraout_XMM0_Qb;
    local_88 = sin(pose.theta);
    local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pair<int,_int> *)0x0;
    local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pair<int,_int> *)0x0;
    local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pair<int,_int> *)0x0;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
              (&local_148,
               ((long)(polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 4) + 1);
    dVar2 = local_b8;
    psVar4 = (polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>)._M_impl.
        super__Vector_impl_data._M_finish == psVar4) {
      iVar5 = 1000000000;
      iVar7 = -1000000000;
      iVar16 = -1000000000;
      local_170.first = 1000000000;
      iVar12 = local_170.first;
    }
    else {
      dVar23 = -local_88;
      local_78 = pose.x;
      dStack_70 = pose.y;
      dStack_110 = (double)local_118;
      dStack_b0 = local_88;
      iVar16 = -1000000000;
      local_170.first = 1000000000;
      local_170.second = 0;
      iVar5 = 1000000000;
      iVar7 = -1000000000;
      uVar10 = 0;
      uVar9 = 1;
      do {
        auVar22._0_8_ = psVar4[uVar10].x * local_b8 + psVar4[uVar10].y * dVar23 + local_78;
        auVar22._8_8_ = psVar4[uVar10].x * dStack_b0 + psVar4[uVar10].y * dVar2 + dStack_70;
        auVar24._8_8_ = dStack_110;
        auVar24._0_8_ = local_118;
        auVar24 = divpd(auVar22,auVar24);
        local_e8.dist_._0_4_ =
             (int)((double)(-(ulong)(0.0 < auVar22._0_8_) & 0x3fe0000000000000 |
                           ~-(ulong)(0.0 < auVar22._0_8_) & 0xbfe0000000000000) + auVar24._0_8_);
        local_e8.dist_._4_4_ =
             (int)((double)(-(ulong)(0.0 < auVar22._8_8_) & 0x3fe0000000000000 |
                           ~-(ulong)(0.0 < auVar22._8_8_) & 0xbfe0000000000000) + auVar24._8_8_);
        if (local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          _M_realloc_insert<std::pair<int,int>const&>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_148,
                     (iterator)
                     local_148.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(pair<int,_int> *)&local_e8);
        }
        else {
          *local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish = (pair<int,_int>)local_e8.dist_;
          local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_148.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pVar1 = local_170;
        if ((int)local_e8.dist_ < local_170.first) {
          pVar1 = (pair<int,_int>)local_e8.dist_;
        }
        local_170 = (pair<int,_int>)((ulong)pVar1 & 0xffffffff);
        if (iVar16 < (int)local_e8.dist_) {
          iVar16 = (int)local_e8.dist_;
        }
        if (local_e8.dist_._4_4_ < iVar5) {
          iVar5 = local_e8.dist_._4_4_;
        }
        if (iVar7 < local_e8.dist_._4_4_) {
          iVar7 = local_e8.dist_._4_4_;
        }
        psVar4 = (polygon->super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        bVar20 = uVar9 < (ulong)((long)(polygon->
                                       super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >>
                                4);
        uVar10 = uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
        iVar12 = pVar1.first;
      } while (bVar20);
    }
    local_170.first = iVar12;
    if (local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      _M_realloc_insert<std::pair<int,int>const&>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_148,
                 (iterator)
                 local_148.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 local_148.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    }
    else {
      *local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           *local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    uVar17 = iVar16 - local_170.first;
    sx = uVar17 + 3;
    uVar10 = 0xffffffffffffffff;
    if (-4 < (int)uVar17) {
      uVar10 = (long)(int)sx << 3;
    }
    grid = (int **)operator_new__(uVar10);
    uVar8 = iVar7 - iVar5;
    local_120 = (ulong)uVar8;
    local_128 = uVar8 + 3;
    if (-3 < (int)uVar17) {
      uVar10 = 0xffffffffffffffff;
      if (-4 < (int)uVar8) {
        uVar10 = (long)(int)local_128 * 4;
      }
      uVar9 = 1;
      if (1 < (int)local_128) {
        uVar9 = (ulong)local_128;
      }
      uVar6 = 1;
      if (1 < (int)sx) {
        uVar6 = (ulong)sx;
      }
      uVar19 = 0;
      do {
        __s = (int *)operator_new__(uVar10);
        grid[uVar19] = __s;
        if (-3 < (int)local_120) {
          memset(__s,0,uVar9 << 2);
        }
        uVar19 = uVar19 + 1;
      } while (uVar6 != uVar19);
    }
    local_118 = &cells->_M_t;
    if (8 < (ulong)((long)local_148.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_148.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
      local_f0 = (ulong)(iVar5 - 1);
      local_f8 = (ulong)(local_170.first - 1);
      uVar10 = 1;
      local_100 = (ulong)uVar17;
      do {
        uVar17 = (int)uVar10 - 1;
        iVar11 = local_148.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar17].first - local_170.first;
        iVar16 = iVar11 + 1;
        iVar3 = local_148.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar17].second - iVar5;
        iVar13 = local_148.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar10].first - local_170.first;
        iVar7 = iVar13 + 1;
        iVar15 = local_148.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar10].second - iVar5;
        iVar12 = iVar15 + 1;
        uVar8 = iVar15 - iVar3;
        iVar3 = iVar3 + 1;
        uVar17 = -uVar8;
        if (0 < (int)uVar8) {
          uVar17 = uVar8;
        }
        uVar14 = iVar13 - iVar11;
        uVar8 = -uVar14;
        if (0 < (int)uVar14) {
          uVar8 = uVar14;
        }
        local_b8 = (double)CONCAT44(local_b8._4_4_,uVar17);
        iVar11 = iVar16;
        iVar13 = iVar7;
        if (uVar8 < uVar17) {
          iVar11 = iVar3;
          iVar13 = iVar12;
          iVar12 = iVar7;
          iVar3 = iVar16;
        }
        iVar16 = iVar12;
        iVar7 = iVar11;
        iVar15 = iVar13;
        if (iVar13 < iVar11) {
          iVar16 = iVar3;
          iVar7 = iVar13;
          iVar15 = iVar11;
          iVar3 = iVar12;
        }
        iVar12 = iVar16 - iVar3;
        bVar20 = iVar12 != 0 && iVar3 <= iVar16;
        iVar16 = -iVar12;
        if (0 < iVar12) {
          iVar16 = iVar12;
        }
        local_78 = (double)CONCAT44(local_78._4_4_,iVar16);
        local_124 = iVar15 - iVar7;
        local_60 = uVar10;
        if (iVar7 <= iVar15) {
          if (iVar13 < iVar11) {
            iVar11 = iVar13;
          }
          local_50 = (ulong)((bVar20 - 1) + (uint)bVar20);
          local_58 = (long)iVar11;
          local_40 = grid + local_58;
          local_48 = local_58 * 4;
          local_38 = (ulong)(uint)(iVar15 - iVar11);
          local_98 = (ulong)(uint)((int)local_f0 + iVar11);
          local_a0 = (ulong)(uint)((int)local_f8 + iVar11);
          local_88 = (double)(ulong)((iVar15 - iVar7) + 1);
          lVar18 = 0;
          iVar16 = local_124 / 2;
          do {
            iVar7 = (int)lVar18;
            if (uVar8 < local_b8._0_4_) {
              *(undefined4 *)((long)grid[iVar3] + lVar18 * 4 + local_48) = 1;
              local_e8.dist_ = (int **)CONCAT44((int)local_98 + iVar7,(int)local_f8 + iVar3);
              std::
              _Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
              ::_M_insert_unique<sbpl_2Dcell_t>(&cells->_M_t,(sbpl_2Dcell_t *)&local_e8);
            }
            else {
              local_40[lVar18][iVar3] = 1;
              local_e8.dist_ = (int **)CONCAT44((int)local_f0 + iVar3,(int)local_a0 + iVar7);
              std::
              _Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
              ::_M_insert_unique<sbpl_2Dcell_t>(&cells->_M_t,(sbpl_2Dcell_t *)&local_e8);
            }
            iVar12 = iVar16 - local_78._0_4_;
            if ((iVar12 < 0) && ((int)local_38 != iVar7)) {
              iVar11 = -iVar12;
              iVar13 = iVar3 + (int)local_50;
              bVar20 = iVar16 + iVar12 < 0;
              if (SBORROW4(iVar16,iVar11) != bVar20) {
                iVar3 = iVar13;
              }
              iVar15 = (uint)(SBORROW4(iVar16,iVar11) == bVar20) + (int)local_58 + iVar7;
              if (uVar8 < local_b8._0_4_) {
                grid[iVar3][iVar15] = 1;
                local_e8.dist_ =
                     (int **)CONCAT44((uint)(SBORROW4(iVar16,iVar11) == iVar16 + iVar12 < 0) +
                                      (int)local_98 + iVar7,iVar3 + (int)local_f8);
                std::
                _Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
                ::_M_insert_unique<sbpl_2Dcell_t>(local_118,(sbpl_2Dcell_t *)&local_e8);
              }
              else {
                grid[iVar15][iVar3] = 1;
                local_e8.dist_ =
                     (int **)CONCAT44(iVar3 + (int)local_f0,
                                      (uint)(SBORROW4(iVar16,iVar11) == iVar16 + iVar12 < 0) +
                                      (int)local_a0 + iVar7);
                std::
                _Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
                ::_M_insert_unique<sbpl_2Dcell_t>(local_118,(sbpl_2Dcell_t *)&local_e8);
              }
              iVar12 = iVar12 + local_124;
              iVar3 = iVar13;
            }
            lVar18 = lVar18 + 1;
            cells = (set<sbpl_2Dcell_t,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_> *)
                    local_118;
            iVar16 = iVar12;
          } while (local_88._0_4_ != (int)lVar18);
        }
        uVar10 = (ulong)((int)local_60 + 1);
        uVar17 = (uint)local_100;
      } while (uVar10 < (ulong)((long)local_148.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_148.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    sbpl_bfs_2d::sbpl_bfs_2d(&local_e8,sx,local_128,1,-1);
    sbpl_bfs_2d::compute_distance_from_point(&local_e8,grid,0,0);
    if (-3 < (int)uVar17) {
      uVar10 = 1;
      if (1 < (int)sx) {
        uVar10 = (ulong)sx;
      }
      uVar9 = 0;
      do {
        if (grid[uVar9] != (int *)0x0) {
          operator_delete__(grid[uVar9]);
        }
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
    }
    operator_delete__(grid);
    if (-1 < (int)uVar17) {
      iVar16 = (int)local_120;
      local_100 = (ulong)(uVar17 + 2);
      uVar10 = 1;
      do {
        if (-1 < (int)local_120) {
          lVar18 = 0;
          do {
            if (*(int *)(*(long *)((long)local_e8.dist_ + uVar10 * 8) + 4 + lVar18 * 4) < 0) {
              local_90.y = iVar5 + (int)lVar18;
              local_90.x = local_170.first + -1 + (int)uVar10;
              std::
              _Rb_tree<sbpl_2Dcell_t,_sbpl_2Dcell_t,_std::_Identity<sbpl_2Dcell_t>,_std::less<sbpl_2Dcell_t>,_std::allocator<sbpl_2Dcell_t>_>
              ::_M_insert_unique<sbpl_2Dcell_t>(local_118,&local_90);
            }
            lVar18 = lVar18 + 1;
          } while ((ulong)(iVar16 + 2) - 1 != lVar18);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != local_100);
    }
    sbpl_bfs_2d::~sbpl_bfs_2d(&local_e8);
    if (local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pair<int,_int> *)0x0) {
      operator_delete(local_148.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_148.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_148.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void get_2d_footprint_cells(vector<sbpl_2Dpt_t> polygon, set<sbpl_2Dcell_t>* cells, sbpl_xy_theta_pt_t pose, double res)
{
    //special case for point robot
    if (polygon.size() <= 1) {
        sbpl_2Dcell_t cell;
        cell.x = CONTXY2DISC(pose.x, res);
        cell.y = CONTXY2DISC(pose.y, res);

        cells->insert(cell);
        return;
    }

    //run bressenham line algorithm around the polygon (add them to the cells set)
    //while doing that find the min and max (x,y) and the average x and y
    double cth = cos(pose.theta);
    double sth = sin(pose.theta);

    vector<pair<int, int> > disc_polygon;
    disc_polygon.reserve(polygon.size() + 1);
    int minx = INFINITECOST;
    int maxx = -INFINITECOST;
    int miny = INFINITECOST;
    int maxy = -INFINITECOST;

    //find the bounding box of the polygon
    for (unsigned int i = 0; i < polygon.size(); i++) {
        pair<int, int> p;
        //		p.first = CONTXY2DISC(cth*polygon[i].x - sth*polygon[i].y + pose.x, res);
        double cx = (cth * polygon[i].x - sth * polygon[i].y + pose.x);
        double cy = (sth * polygon[i].x + cth * polygon[i].y + pose.y);
        p.first = (int)(cx > 0 ? cx / res + 0.5 : cx / res - 0.5); //(int)(cx / res + 0.5 * sign(c);
        //		p.second = CONTXY2DISC(sth*polygon[i].x + cth*polygon[i].y + pose.y, res);
        p.second = (int)(cy > 0 ? cy / res + 0.5 : cy / res - 0.5);//(int)(cy / res + 0.5);
        disc_polygon.push_back(p);
        if (p.first < minx) minx = p.first;
        if (p.first > maxx) maxx = p.first;
        if (p.second < miny) miny = p.second;
        if (p.second > maxy) maxy = p.second;
    }
    disc_polygon.push_back(disc_polygon.front());

    //make a grid big enough for the footprint
    int sizex = (maxx - minx + 1) + 2;
    int sizey = (maxy - miny + 1) + 2;
    int** grid = new int*[sizex];
    for (int i = 0; i < sizex; i++) {
        grid[i] = new int[sizey];
        for (int j = 0; j < sizey; j++)
            grid[i][j] = 0;
    }

    //plot line points on the grid
    for (unsigned int i = 1; i < disc_polygon.size(); i++) {
        int x0 = disc_polygon[i - 1].first - minx + 1;
        int y0 = disc_polygon[i - 1].second - miny + 1;
        int x1 = disc_polygon[i].first - minx + 1;
        int y1 = disc_polygon[i].second - miny + 1;

        //bressenham (add the line cells to the set and to a vector)
        bool steep = abs(y1 - y0) > abs(x1 - x0);
        if (steep) {
            int temp = x0;
            x0 = y0;
            y0 = temp;
            temp = x1;
            x1 = y1;
            y1 = temp;
        }
        if (x0 > x1) {
            int temp = x0;
            x0 = x1;
            x1 = temp;
            temp = y0;
            y0 = y1;
            y1 = temp;
        }
        int deltax = x1 - x0;
        int deltay = abs(y1 - y0);
        int error = deltax / 2;
        int ystep = (y0 < y1 ? 1 : -1);
        int y = y0;
        for (int x = x0; x <= x1; x++) {
            if (steep) {
                grid[y][x] = 1;
                cells->insert(sbpl_2Dcell_t(y - 1 + minx, x - 1 + miny));
            }
            else {
                grid[x][y] = 1;
                cells->insert(sbpl_2Dcell_t(x - 1 + minx, y - 1 + miny));
            }
            int last_error = error;
            error -= deltay;
            if (error < 0 && x != x1) {
                //make sure we can't have a diagonal line (the 8-connected bfs will leak through)

                int tempy = y;
                int tempx = x;
                if (last_error < -error)
                    tempy += ystep;
                else
                    tempx += 1;
                if (steep) {
                    grid[tempy][tempx] = 1;
                    cells->insert(sbpl_2Dcell_t(tempy - 1 + minx, tempx - 1 + miny));
                }
                else {
                    grid[tempx][tempy] = 1;
                    cells->insert(sbpl_2Dcell_t(tempx - 1 + minx, tempy - 1 + miny));
                }

                y += ystep;
                error += deltax;
            }
        }
    }

    //run a 2d bfs from the average (x,y)
    sbpl_bfs_2d bfs(sizex, sizey, 1);
    bfs.compute_distance_from_point(grid, 0, 0);

    for (int i = 0; i < sizex; i++)
        delete[] grid[i];
    delete[] grid;

    //add all cells expanded to the cells set
    for (int i = 1; i < sizex - 1; i++) {
        for (int j = 1; j < sizey - 1; j++) {
            if (bfs.get_distance(i, j) < 0) cells->insert(sbpl_2Dcell_t(i - 1 + minx, j - 1 + miny));
        }
    }
}